

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

bool __thiscall
testing::internal::
CartesianProductGenerator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_false>
  _Var1;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> _Var2;
  unique_ptr<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  uVar3;
  undefined1 uVar4;
  int iVar5;
  
  _Var1._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_false>
       ._M_head_impl;
  if (_Var1._M_head_impl !=
      ((ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)> *)
      (this->end_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_false>
      ._M_head_impl.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_false>
      )._M_head_impl) {
    iVar5 = (*(_Var1._M_head_impl)->_vptr_ParamIteratorInterface[6])();
    if ((char)iVar5 == '\0') {
      _Var1._M_head_impl =
           (this->current_).
           super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
           .
           super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
           .
           super__Head_base<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_false>
           ._M_head_impl.impl_._M_t.
           super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
           .
           super__Head_base<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_false>
           ._M_head_impl;
      if (_Var1._M_head_impl !=
          ((ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)> *)
          (this->end_).
          super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
          .
          super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
          .
          super__Head_base<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_false>
          ._M_head_impl.impl_._M_t.
          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_>_>
          .
          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>_*,_false>
          )._M_head_impl) {
        iVar5 = (*(_Var1._M_head_impl)->_vptr_ParamIteratorInterface[6])();
        if ((char)iVar5 == '\0') {
          _Var2._M_head_impl =
               (this->current_).
               super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
               .
               super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
               .
               super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
               .super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.
               impl_._M_t.
               super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
               .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>.
               _M_head_impl;
          if (_Var2._M_head_impl !=
              ((ParamIteratorInterface<int> *)
              (this->end_).
              super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
              .
              super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
              .
              super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
              .super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.
              impl_._M_t.
              super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
              .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>).
              _M_head_impl) {
            iVar5 = (*(_Var2._M_head_impl)->_vptr_ParamIteratorInterface[6])();
            if ((char)iVar5 == '\0') {
              uVar3._M_t.
              super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
              .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>.
              _M_head_impl = (this->current_).
                             super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                             .
                             super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                             .
                             super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                             .super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>_>.
                             super__Head_base<3UL,_testing::internal::ParamIterator<int>,_false>.
                             _M_head_impl.impl_._M_t;
              if (uVar3._M_t.
                  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>.
                  _M_head_impl !=
                  (__uniq_ptr_data<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>,_true,_true>
                   )(this->end_).
                    super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                    .
                    super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                    .super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>_>.
                    super__Head_base<3UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl
                    .impl_) {
                uVar4 = (**(code **)(*(long *)uVar3._M_t.
                                              super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                                              .
                                              super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                                              ._M_head_impl + 0x30))();
                return (bool)uVar4;
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }